

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::IntLoadConstraint_C
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChConstraintTwoBodies *pCVar5;
  undefined1 auVar6 [16];
  char cVar7;
  ulong uVar8;
  char *__function;
  long lVar9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001208 [56];
  undefined8 in_XMM1_Qb;
  undefined1 auVar18 [64];
  ulong local_48;
  
  auVar18._8_56_ = in_register_00001208;
  auVar18._0_8_ = c;
  if (0 < (this->mask).nconstr) {
    auVar18 = ZEXT1664(auVar18._0_16_);
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = recovery_clamp;
    auVar13._8_8_ = 0x8000000000000000;
    auVar13._0_8_ = 0x8000000000000000;
    auVar13 = vxorpd_avx512vl(auVar6,auVar13);
    lVar12 = 0;
    iVar10 = 0;
    do {
      if ((this->mask).nconstr <= lVar12) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar5 = (this->mask).constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12];
      if ((pCVar5->super_ChConstraintTwo).super_ChConstraint.active == true) {
        lVar9 = (long)iVar10;
        if (do_clamp) {
          cVar7 = (**(code **)((long)(pCVar5->super_ChConstraintTwo).super_ChConstraint.
                                     _vptr_ChConstraint + 0x18))();
          local_48 = auVar13._0_8_;
          if (cVar7 == '\0') {
            if ((iVar10 < 0) ||
               ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                m_rows <= lVar9)) goto LAB_005b33f9;
            uVar8 = (ulong)(iVar10 + off_L);
            if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows <= (long)uVar8) goto LAB_005b33e2;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_48;
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 c * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[lVar9];
            auVar6 = vmaxsd_avx(auVar17,auVar3);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = recovery_clamp;
            auVar6 = vminsd_avx(auVar6,auVar4);
            dVar14 = auVar6._0_8_;
          }
          else {
            if ((iVar10 < 0) ||
               ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                m_rows <= lVar9)) {
LAB_005b33f9:
              __function = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
              ;
LAB_005b340e:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,__function)
              ;
            }
            uVar8 = (ulong)(iVar10 + off_L);
            if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows <= (long)uVar8) {
LAB_005b33e2:
              __function = 
              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
              ;
              goto LAB_005b340e;
            }
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_48;
            auVar15._8_8_ = 0;
            auVar15._0_8_ =
                 c * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[lVar9];
            auVar6 = vmaxsd_avx(auVar15,auVar1);
            dVar14 = auVar6._0_8_;
          }
          auVar18 = ZEXT864((ulong)c);
          pdVar11 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          dVar14 = dVar14 + pdVar11[uVar8];
        }
        else {
          if ((iVar10 < 0) ||
             ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
              m_rows <= lVar9)) goto LAB_005b33f9;
          uVar8 = (ulong)(iVar10 + off_L);
          if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar8) goto LAB_005b33e2;
          auVar16._8_8_ = 0;
          auVar16._0_8_ =
               (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
               m_data.array[lVar9];
          pdVar11 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar11[uVar8];
          auVar6 = vfmadd213sd_fma(auVar16,auVar18._0_16_,auVar2);
          dVar14 = auVar6._0_8_;
        }
        pdVar11[uVar8] = dVar14;
        iVar10 = iVar10 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->mask).nconstr);
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntLoadConstraint_C(const unsigned int off_L,
                                            ChVectorDynamic<>& Qc,
                                            const double c,
                                            bool do_clamp,
                                            double recovery_clamp) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            if (do_clamp) {
                if (mask.Constr_N(i).IsUnilateral())
                    Qc(off_L + cnt) += ChMax(c * C(cnt), -recovery_clamp);
                else
                    Qc(off_L + cnt) += ChMin(ChMax(c * C(cnt), -recovery_clamp), recovery_clamp);
            } else
                Qc(off_L + cnt) += c * C(cnt);
            cnt++;
        }
    }
}